

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O0

bool __thiscall
density::
lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>
::try_emplace<std::__cxx11::string,int,char>
          (lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>
           *this,progress_guarantee i_progress_guarantee,int *i_construction_params,
          char *i_construction_params_1)

{
  bool bVar1;
  put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  undefined1 local_50 [8];
  put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tranasction;
  char *i_construction_params_local_1;
  int *i_construction_params_local;
  progress_guarantee i_progress_guarantee_local;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  *this_local;
  
  tranasction.m_queue =
       (lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
        *)i_construction_params_1;
  try_start_emplace<std::__cxx11::string,int,char>
            (&local_70,this,i_progress_guarantee,i_construction_params,i_construction_params_1);
  put_transaction<std::__cxx11::string>::put_transaction<std::__cxx11::string,void>
            ((put_transaction<std::__cxx11::string> *)local_50,&local_70);
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::
  put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~put_transaction(&local_70);
  bVar1 = density::lf_heter_queue::put_transaction::operator_cast_to_bool
                    ((put_transaction *)local_50);
  if (bVar1) {
    lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    ::
    put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::commit((put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_50);
  }
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::
  put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~put_transaction((put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_50);
  return bVar1;
}

Assistant:

bool
          try_emplace(progress_guarantee i_progress_guarantee, CONSTRUCTION_PARAMS &&... i_construction_params) noexcept(
            noexcept(std::declval<lf_heter_queue>().template try_start_emplace<ELEMENT_TYPE>(
              i_progress_guarantee, std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...)))
        {
            auto tranasction = try_start_emplace<ELEMENT_TYPE>(
              i_progress_guarantee, std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            if (!tranasction)
                return false;
            tranasction.commit();
            return true;
        }